

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

void __thiscall
ptc::Print<char>::
print_backend<std::__cxx11::ostringstream&,char_const(&)[8],char_const(&)[12],char_const(&)[15]>
          (Print<char> *this,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *os,
          char (*first) [8],char (*args) [12],char (*args_1) [15])

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  bool local_10c;
  bool local_10a;
  byte local_69;
  ANSI local_5c [8];
  ANSI local_3c;
  lock_guard<std::mutex> local_38;
  lock_guard<std::mutex> lock;
  char (*args_local_1) [15];
  char (*args_local) [12];
  char (*first_local) [8];
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *os_local;
  Print<char> *this_local;
  
  lock._M_device = (mutex_type *)args_1;
  std::lock_guard<std::mutex>::lock_guard(&local_38,(mutex_type *)mutex_);
  local_3c = first;
  bVar1 = is_escape<char[8]>(first,&local_3c);
  local_69 = 1;
  if (!bVar1) {
    local_69 = std::__cxx11::string::empty();
  }
  if ((local_69 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)os,(string *)&this->pattern);
    poVar2 = std::operator<<(poVar2,*first);
    std::operator<<(poVar2,(string *)&this->pattern);
  }
  else {
    std::operator<<((ostream *)os,*first);
  }
  local_5c[3] = 0;
  bVar1 = is_escape<char[8]>(first,local_5c + 3);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)os,(string *)&this->pattern);
      poVar2 = std::operator<<(poVar2,*args);
      poVar2 = std::operator<<(poVar2,(string *)&this->pattern);
      std::operator<<(poVar2,(string *)&this->sep);
      poVar2 = std::operator<<((ostream *)os,(string *)&this->pattern);
      poVar2 = std::operator<<(poVar2,(char *)lock._M_device);
      poVar2 = std::operator<<(poVar2,(string *)&this->pattern);
      std::operator<<(poVar2,(string *)&this->sep);
    }
    else {
      poVar2 = std::operator<<((ostream *)os,*args);
      std::operator<<(poVar2,(string *)&this->sep);
      poVar2 = std::operator<<((ostream *)os,(char *)lock._M_device);
      std::operator<<(poVar2,(string *)&this->sep);
    }
  }
  else {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)os,(string *)&this->sep);
      poVar2 = std::operator<<(poVar2,(string *)&this->pattern);
      poVar2 = std::operator<<(poVar2,*args);
      std::operator<<(poVar2,(string *)&this->pattern);
      poVar2 = std::operator<<((ostream *)os,(string *)&this->sep);
      poVar2 = std::operator<<(poVar2,(string *)&this->pattern);
      poVar2 = std::operator<<(poVar2,(char *)lock._M_device);
      std::operator<<(poVar2,(string *)&this->pattern);
    }
    else {
      poVar2 = std::operator<<((ostream *)os,(string *)&this->sep);
      std::operator<<(poVar2,*args);
      poVar2 = std::operator<<((ostream *)os,(string *)&this->sep);
      std::operator<<(poVar2,(char *)lock._M_device);
    }
  }
  std::operator<<((ostream *)os,(string *)this);
  local_5c[2] = 1;
  bVar1 = is_escape<char[8]>(first,local_5c + 2);
  local_10a = true;
  if (!bVar1) {
    local_5c[1] = 1;
    bVar1 = is_escape<char[12]>(args,local_5c + 1);
    local_10c = true;
    if (!bVar1) {
      local_5c[0] = generic;
      local_10c = is_escape<char[15]>((char (*) [15])lock._M_device,local_5c);
    }
    local_10a = local_10c;
  }
  if (local_10a != false) {
    std::operator<<((ostream *)os,"\x1b[0m");
  }
  if ((this->flush & 1U) != 0) {
    std::ostream::operator<<(os,std::flush<char,std::char_traits<char>>);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_38);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }